

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *lhss;
  char *rhss;
  ostream *poVar3;
  cmake *this_00;
  reference ppcVar4;
  cmMakefile *this_01;
  bool local_2f9;
  allocator local_2a1;
  string local_2a0;
  string local_280;
  allocator local_259;
  string local_258;
  string local_238;
  cmListFileBacktrace local_218;
  string local_1f8;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  ostringstream msg;
  string local_30 [32];
  cmGlobalNinjaGenerator *local_10;
  cmGlobalNinjaGenerator *this_local;
  
  local_10 = this;
  lhss = (char *)std::__cxx11::string::c_str();
  RequiredNinjaVersion_abi_cxx11_();
  rhss = (char *)std::__cxx11::string::c_str();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhss,rhss);
  std::__cxx11::string::~string(local_30);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    poVar3 = std::operator<<((ostream *)local_1b8,"The detected version of Ninja (");
    std::operator<<(poVar3,(string *)&this->NinjaVersion);
    std::operator<<((ostream *)local_1b8,") is less than the version of Ninja required by CMake (");
    RequiredNinjaVersion_abi_cxx11_();
    poVar3 = std::operator<<((ostream *)local_1b8,local_1d8);
    std::operator<<(poVar3,").");
    std::__cxx11::string::~string(local_1d8);
    this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    std::__cxx11::ostringstream::str();
    cmListFileBacktrace::cmListFileBacktrace(&local_218);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_1f8,&local_218);
    cmListFileBacktrace::~cmListFileBacktrace(&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  }
  else {
    OpenBuildFileStream(this);
    OpenRulesFileStream(this);
    std::
    map<const_cmGeneratorTarget_*,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
    ::clear(&this->TargetDependsClosures);
    InitOutputPathPrefix(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_258,"all",&local_259);
    NinjaOutputPath(&local_238,this,&local_258);
    std::__cxx11::string::operator=((string *)&this->TargetAll,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a0,"CMakeCache.txt",&local_2a1);
    NinjaOutputPath(&local_280,this,&local_2a0);
    std::__cxx11::string::operator=((string *)&this->CMakeCacheFile,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          LocalGenerators,0);
    this_01 = cmLocalGenerator::GetMakefile(*ppcVar4);
    PVar2 = cmMakefile::GetPolicyStatus(this_01,CMP0058);
    this->PolicyCMP0058 = PVar2;
    local_2f9 = true;
    if (this->PolicyCMP0058 != OLD) {
      local_2f9 = this->PolicyCMP0058 == WARN;
    }
    this->ComputingUnknownDependencies = local_2f9;
    cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
    WriteAssumedSourceDependencies(this);
    WriteTargetAliases(this,(ostream *)this->BuildFileStream);
    WriteFolderTargets(this,(ostream *)this->BuildFileStream);
    WriteUnknownExplicitDependencies(this,(ostream *)this->BuildFileStream);
    WriteBuiltinTargets(this,(ostream *)this->BuildFileStream);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      std::ios::setstate((int)this->RulesFileStream +
                         (int)(this->RulesFileStream->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]);
      std::ios::setstate((int)this->BuildFileStream +
                         (int)(this->BuildFileStream->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]);
    }
    CloseCompileCommandsStream(this);
    CloseRulesFileStream(this);
    CloseBuildFileStream(this);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  // Check minimum Ninja version.
  if (cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                    this->NinjaVersion.c_str(),
                                    RequiredNinjaVersion().c_str())) {
    std::ostringstream msg;
    msg << "The detected version of Ninja (" << this->NinjaVersion;
    msg << ") is less than the version of Ninja required by CMake (";
    msg << this->RequiredNinjaVersion() << ").";
    this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, msg.str());
    return;
  }
  this->OpenBuildFileStream();
  this->OpenRulesFileStream();

  this->TargetDependsClosures.clear();

  this->InitOutputPathPrefix();
  this->TargetAll = this->NinjaOutputPath("all");
  this->CMakeCacheFile = this->NinjaOutputPath("CMakeCache.txt");

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()->GetPolicyStatus(
      cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->BuildFileStream);
  this->WriteFolderTargets(*this->BuildFileStream);
  this->WriteUnknownExplicitDependencies(*this->BuildFileStream);
  this->WriteBuiltinTargets(*this->BuildFileStream);

  if (cmSystemTools::GetErrorOccuredFlag()) {
    this->RulesFileStream->setstate(std::ios::failbit);
    this->BuildFileStream->setstate(std::ios::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStream();
}